

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

void __thiscall
QtPrivate::QCalendarView::mouseDoubleClickEvent(QCalendarView *this,QMouseEvent *event)

{
  int iVar1;
  long lVar2;
  QDate QVar3;
  QStyle *pQVar4;
  
  QAbstractItemView::model((QAbstractItemView *)this);
  lVar2 = QMetaObject::cast((QObject *)&QCalendarModel::staticMetaObject);
  if (lVar2 == 0) {
    QAbstractItemView::mouseDoubleClickEvent((QAbstractItemView *)this,event);
    return;
  }
  if (this->readOnly == false) {
    QVar3 = handleMouseEvent(this,event);
    this->validDateClicked = false;
    if (QVar3.jd == *(long *)(lVar2 + 0x20)) {
      pQVar4 = QWidget::style((QWidget *)this);
      iVar1 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x3d,0,this,0);
      if (iVar1 == 0) {
        QMetaObject::activate((QObject *)this,&staticMetaObject,3,(void **)0x0);
        return;
      }
    }
  }
  return;
}

Assistant:

void QCalendarView::mouseDoubleClickEvent(QMouseEvent *event)
{
    QCalendarModel *calendarModel = qobject_cast<QCalendarModel *>(model());
    if (!calendarModel) {
        QTableView::mouseDoubleClickEvent(event);
        return;
    }

    if (readOnly)
        return;

    QDate date = handleMouseEvent(event);
    validDateClicked = false;
    if (date == calendarModel->m_date &&
        !style()->styleHint(QStyle::SH_ItemView_ActivateItemOnSingleClick, nullptr, this)) {
        emit editingFinished();
    }
}